

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  long lVar1;
  ctrl_t *pcVar2;
  bool bVar3;
  uintptr_t v;
  ulong uVar4;
  long lVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t hash;
  size_t sVar6;
  undefined8 uVar7;
  ctrl_t cVar8;
  ulong uVar9;
  ulong uVar10;
  FindInfo FVar11;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50.heap.control = (common->heap_or_soo_).heap.control;
    local_50.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,8,0x20);
    if (local_40 != 0) {
      if (bVar3) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,void>,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                  ((HashSetResizeHelper *)&local_50.heap,common,
                   (allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>
                    *)common);
      }
      else {
        if ((char)local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar1 = *(long *)((long)&common->heap_or_soo_ + 8);
          sVar6 = 0;
          hash = extraout_RDX;
          uVar7 = local_50.heap.slot_array;
          do {
            if ((char)local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar6]) {
              uVar9 = (*(ulong *)uVar7 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                      -0x234dd359734ecb13;
              uVar10 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                         (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                         (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) ^ *(ulong *)uVar7) *
                       -0x234dd359734ecb13;
              FVar11 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8
                                   | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38),hash);
              uVar4 = FVar11.offset;
              uVar9 = common->capacity_;
              if (uVar9 <= uVar4) {
                __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x744,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar8 = (ctrl_t)(uVar10 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar4] = cVar8;
              pcVar2[(ulong)((uint)uVar9 & 0xf) + (uVar4 - 0xf & uVar9)] = cVar8;
              lVar5 = uVar4 * 0x20;
              common->capacity_ = 0xffffffffffffff9c;
              *(ulong *)(lVar1 + lVar5) = *(ulong *)uVar7;
              *(ulong *)(lVar1 + 8 + lVar5) = *(ulong *)(uVar7 + 8);
              *(ulong *)(lVar1 + 0x10 + lVar5) = *(ulong *)(uVar7 + 0x10);
              *(ulong *)(lVar1 + 0x18 + lVar5) = *(ulong *)(uVar7 + 0x18);
              *(ulong *)(uVar7 + 8) = 0;
              *(ulong *)(uVar7 + 0x10) = 0;
              *(ulong *)(uVar7 + 0x18) = 0;
              CommonFields::set_capacity(common,uVar9);
              hash = extraout_RDX_00;
            }
            sVar6 = sVar6 + 1;
            uVar7 = uVar7 + 0x20;
          } while (sVar6 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }